

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.h
# Opt level: O0

int assembler::diffWithWrap<16777216u>(uint a,uint b)

{
  runtime_error *prVar1;
  uint in_ESI;
  uint in_EDI;
  int skip;
  int *in_stack_00000110;
  char (*in_stack_00000118) [2];
  char (*in_stack_00000120) [101];
  char (*in_stack_00000128) [29];
  string local_68 [35];
  undefined1 local_45;
  undefined4 local_34;
  string local_30 [36];
  int local_c;
  
  if (0xffffff < in_EDI) {
    local_45 = 1;
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_34 = 0x18;
    util::str<char[29],char[101],char[2],int>
              (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110);
    std::runtime_error::runtime_error(prVar1,local_30);
    local_45 = 0;
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0xffffff < in_ESI) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    util::str<char[29],char[101],char[2],int>
              (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110);
    std::runtime_error::runtime_error(prVar1,local_68);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (in_ESI < in_EDI) {
    local_c = 0x1000000 - in_EDI;
  }
  else {
    local_c = -in_EDI;
  }
  local_c = in_ESI + local_c;
  return local_c;
}

Assistant:

int diffWithWrap(unsigned int a, unsigned int b) {
  int skip;

  ASSERT(a < N);
  ASSERT(b < N);

  if (a <= b) {
    skip = b - a;
  } else {
    skip = N - a + b;
  }

  return skip;
}